

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_facelift.c
# Opt level: O3

REF_STATUS ref_facelift_multiscale(REF_GRID ref_grid,REF_DBL target_complexity)

{
  REF_NODE ref_node;
  REF_FACELIFT ref_facelift;
  REF_CELL ref_cell;
  REF_GLOB *pRVar1;
  uint uVar2;
  REF_STATUS RVar3;
  int iVar4;
  REF_DBL *recon;
  REF_DBL *pRVar5;
  ulong uVar6;
  undefined8 uVar7;
  ulong uVar8;
  long lVar9;
  REF_DBL *pRVar10;
  char *pcVar11;
  long lVar12;
  REF_INT cell;
  double dVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined4 uVar16;
  undefined4 uVar17;
  REF_DBL det;
  REF_DBL area;
  REF_DBL diag_system2 [6];
  REF_DBL n [3];
  REF_DBL s [3];
  REF_DBL r [3];
  REF_DBL combined [6];
  REF_DBL diag_system [12];
  REF_DBL m [6];
  REF_INT nodes [27];
  double local_228;
  double local_220;
  REF_DBL local_218;
  double local_200;
  REF_DBL local_1f8;
  undefined8 local_1f0;
  double local_1e8;
  double local_1e0;
  double local_1d8;
  double local_1d0;
  REF_DBL local_1c8;
  undefined8 uStack_1c0;
  undefined8 local_1b8;
  REF_DBL local_1a8 [4];
  REF_DBL local_188 [4];
  REF_DBL local_168;
  REF_DBL RStack_160;
  REF_DBL local_158;
  REF_DBL RStack_150;
  REF_DBL local_148;
  REF_DBL RStack_140;
  REF_DBL local_138;
  undefined8 local_130;
  double adStack_120 [6];
  REF_DBL local_f0;
  undefined8 uStack_e8;
  undefined8 local_e0;
  REF_DBL local_d8 [6];
  REF_INT local_a8 [30];
  
  ref_node = ref_grid->node;
  ref_facelift = ref_grid->geom->ref_facelift;
  local_218 = target_complexity;
  if (ref_facelift != (REF_FACELIFT)0x0) {
    ref_facelift_free(ref_facelift);
  }
  uVar2 = ref_facelift_attach(ref_grid);
  if (uVar2 == 0) {
    if (ref_node->max < 0) {
      pcVar11 = "malloc metric of REF_DBL negative";
      uVar7 = 0x591;
LAB_00150cc8:
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_facelift.c",
             uVar7,"ref_facelift_multiscale",pcVar11);
      return 1;
    }
    ref_cell = ref_grid->geom->ref_facelift->tri_cell;
    recon = (REF_DBL *)malloc((ulong)(uint)ref_node->max * 0x30);
    if (recon == (REF_DBL *)0x0) {
      pcVar11 = "malloc metric of REF_DBL NULL";
      uVar7 = 0x591;
LAB_00150cf7:
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_facelift.c",
             uVar7,"ref_facelift_multiscale",pcVar11);
      return 2;
    }
    uVar2 = ref_grid->node->max;
    uVar6 = (ulong)uVar2;
    if ((int)uVar2 < 0) {
      pcVar11 = "malloc hess of REF_DBL negative";
      uVar7 = 0x593;
      goto LAB_00150cc8;
    }
    pRVar5 = (REF_DBL *)malloc(uVar6 * 0x18);
    if (pRVar5 == (REF_DBL *)0x0) {
      pcVar11 = "malloc hess of REF_DBL NULL";
      uVar7 = 0x593;
      goto LAB_00150cf7;
    }
    if (uVar6 != 0) {
      memset(pRVar5,0,(uVar6 * 3 & 0xffffffff) << 3);
    }
    uVar2 = ref_recon_rsn_hess_face(ref_grid,pRVar5);
    if (uVar2 == 0) {
      if (0 < ref_node->max) {
        lVar12 = 0;
        pRVar10 = pRVar5;
        do {
          if (-1 < ref_node->global[lVar12]) {
            uVar2 = ref_matrix_det_m2(pRVar5 + lVar12 * 3,&local_220);
            if (uVar2 != 0) {
              pcVar11 = "2x2 det";
              uVar7 = 0x596;
              goto LAB_00150b94;
            }
            if (0.0 < local_220) {
              lVar9 = 0;
              do {
                dVar13 = pow(local_220,-0.16666666666666666);
                pRVar10[lVar9] = dVar13 * pRVar10[lVar9];
                lVar9 = lVar9 + 1;
              } while (lVar9 != 3);
            }
          }
          lVar12 = lVar12 + 1;
          pRVar10 = pRVar10 + 3;
        } while (lVar12 < ref_node->max);
      }
      if (ref_cell->max < 1) {
        local_228 = 0.0;
      }
      else {
        cell = 0;
        local_228 = 0.0;
        do {
          RVar3 = ref_cell_nodes(ref_cell,cell,local_a8);
          if (RVar3 == 0) {
            uVar2 = ref_node_tri_area(ref_node,local_a8,&local_200);
            if (uVar2 != 0) {
              pcVar11 = "area";
              uVar7 = 0x59e;
              goto LAB_00150b94;
            }
            iVar4 = ref_cell->node_per;
            if (0 < iVar4) {
              lVar12 = 0;
              do {
                if (ref_node->ref_mpi->id == ref_node->part[local_a8[lVar12]]) {
                  uVar2 = ref_matrix_det_m2(pRVar5 + (long)local_a8[lVar12] * 3,&local_220);
                  if (uVar2 != 0) {
                    pcVar11 = "2x2 det";
                    uVar7 = 0x5a1;
                    goto LAB_00150b94;
                  }
                  if (local_220 <= 0.0) {
                    iVar4 = ref_cell->node_per;
                  }
                  else {
                    if (local_220 < 0.0) {
                      dVar13 = sqrt(local_220);
                    }
                    else {
                      dVar13 = SQRT(local_220);
                    }
                    iVar4 = ref_cell->node_per;
                    local_228 = local_228 + (dVar13 * local_200) / (double)iVar4;
                  }
                }
                lVar12 = lVar12 + 1;
              } while (lVar12 < iVar4);
            }
          }
          cell = cell + 1;
        } while (cell < ref_cell->max);
      }
      auVar14._0_8_ = local_228 * 1e+20;
      auVar14._8_8_ = local_218;
      auVar15._8_4_ = SUB84(local_218,0);
      auVar15._0_8_ = -auVar14._0_8_;
      auVar15._12_4_ = (uint)((ulong)local_218 >> 0x20) ^ 0x80000000;
      auVar15 = maxpd(auVar14,auVar15);
      dVar13 = auVar15._8_8_;
      if (auVar15._0_8_ <= dVar13) {
        pcVar11 = "zero compelxity";
        uVar2 = 4;
        uVar7 = 0x5ab;
        uVar6 = 4;
        goto LAB_00150b97;
      }
      iVar4 = ref_node->max;
      uVar6 = (ulong)iVar4;
      if (0 < (long)uVar6) {
        pRVar1 = ref_node->global;
        uVar8 = 0;
        pRVar10 = pRVar5;
        do {
          if (-1 < pRVar1[uVar8]) {
            lVar12 = 0;
            do {
              dVar13 = pRVar10[lVar12] * (local_218 / local_228);
              pRVar10[lVar12] = dVar13;
              lVar12 = lVar12 + 1;
            } while (lVar12 != 3);
          }
          uVar8 = uVar8 + 1;
          pRVar10 = pRVar10 + 3;
        } while (uVar8 != uVar6);
        if (0 < iVar4) {
          lVar12 = 0;
          do {
            if (-1 < ref_node->global[lVar12]) {
              uVar2 = ref_recon_rsn(ref_grid,(REF_INT)lVar12,local_188,local_1a8,&local_1c8);
              if (uVar2 != 0) {
                pcVar11 = "rsn";
                uVar7 = 0x5b6;
                goto LAB_00150b94;
              }
              uVar2 = ref_matrix_diag_m2(pRVar5 + lVar12 * 3,&local_1f8);
              if (uVar2 != 0) {
                pcVar11 = "decomp";
                uVar7 = 0x5b7;
                goto LAB_00150b94;
              }
              local_138 = local_1f8;
              lVar9 = 0;
              do {
                adStack_120[lVar9] = local_188[lVar9] * local_1e8 + local_1a8[lVar9] * local_1e0;
                lVar9 = lVar9 + 1;
              } while (lVar9 != 3);
              uVar16 = (undefined4)local_1f0;
              uVar17 = (undefined4)((ulong)local_1f0 >> 0x20);
              local_130 = local_1f0;
              lVar9 = 0;
              do {
                adStack_120[lVar9 + 3] = local_188[lVar9] * local_1d8 + local_1a8[lVar9] * local_1d0
                ;
                lVar9 = lVar9 + 1;
              } while (lVar9 != 3);
              local_e0 = local_1b8;
              local_f0 = local_1c8;
              uStack_e8 = uStack_1c0;
              uVar2 = ref_matrix_form_m(&local_138,recon + lVar12 * 6);
              dVar13 = (double)CONCAT44(uVar17,uVar16);
              if (uVar2 != 0) {
                pcVar11 = "form m";
                uVar7 = 0x5c8;
                goto LAB_00150b94;
              }
              uVar6 = (ulong)(uint)ref_node->max;
            }
            lVar12 = lVar12 + 1;
          } while (lVar12 < (int)uVar6);
        }
      }
      free(pRVar5);
      uVar2 = ref_recon_roundoff_limit(recon,ref_grid);
      if (uVar2 == 0) {
        uVar2 = ref_facelift_gradation_at_complexity(recon,ref_grid,local_218,dVar13);
        if (uVar2 == 0) {
          iVar4 = ref_node->max;
          if (0 < iVar4) {
            uVar6 = 0;
            lVar12 = 0;
            do {
              if (-1 < ref_node->global[lVar12]) {
                uVar2 = ref_node_metric_get(ref_node,(REF_INT)lVar12,local_d8);
                if (uVar2 != 0) {
                  pcVar11 = "curve metric";
                  uVar7 = 0x5e3;
                  goto LAB_00150b94;
                }
                uVar2 = ref_matrix_intersect((REF_DBL *)((long)recon + uVar6),local_d8,&local_168);
                if (uVar2 != 0) {
                  pcVar11 = "intersect";
                  uVar7 = 0x5e4;
                  goto LAB_00150b94;
                }
                pRVar5 = (REF_DBL *)((uVar6 & 0x7fffffff0) + (long)recon);
                pRVar5[4] = local_148;
                pRVar5[5] = RStack_140;
                pRVar5[2] = local_158;
                pRVar5[3] = RStack_150;
                *pRVar5 = local_168;
                pRVar5[1] = RStack_160;
                iVar4 = ref_node->max;
              }
              lVar12 = lVar12 + 1;
              uVar6 = uVar6 + 0x30;
            } while (lVar12 < iVar4);
          }
          uVar2 = ref_metric_to_node(recon,ref_grid->node);
          if (uVar2 == 0) {
            free(recon);
            return 0;
          }
          pcVar11 = "to";
          uVar7 = 0x5ed;
        }
        else {
          pcVar11 = "gradation at complexity";
          uVar7 = 0x5e0;
        }
      }
      else {
        pcVar11 = "floor eigs above zero";
        uVar7 = 0x5d3;
      }
    }
    else {
      pcVar11 = "rsn";
      uVar7 = 0x594;
    }
  }
  else {
    pcVar11 = "attach";
    uVar7 = 0x58b;
  }
LAB_00150b94:
  uVar6 = (ulong)uVar2;
LAB_00150b97:
  printf("%s: %d: %s: %d %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_facelift.c",uVar7,
         "ref_facelift_multiscale",uVar6,pcVar11);
  return uVar2;
}

Assistant:

REF_FCN REF_STATUS ref_facelift_multiscale(REF_GRID ref_grid,
                                           REF_DBL target_complexity) {
  REF_FACELIFT ref_facelift;
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_CELL ref_cell;
  REF_DBL *hess, *metric;
  REF_INT node, i;
  REF_INT dimension = 2, p_norm = 2;
  REF_INT gradation = -1.0;
  REF_DBL det, exponent, complexity, area, complexity_scale;
  REF_DBL diag_system2[6];
  REF_DBL diag_system[12];
  REF_DBL m[6], combined[6];
  REF_DBL r[3], s[3], n[3];
  REF_BOOL verbose = REF_FALSE;
  REF_BOOL steps = REF_FALSE;
  REF_INT cell_node, cell, nodes[REF_CELL_MAX_SIZE_PER];

  /* reset facelift to match grid */
  ref_facelift = ref_geom_facelift(ref_grid_geom(ref_grid));
  if (NULL != ref_facelift) ref_facelift_free(ref_facelift);
  ref_facelift = NULL;
  RSS(ref_facelift_attach(ref_grid), "attach");
  ref_facelift = ref_geom_facelift(ref_grid_geom(ref_grid));
  ref_cell = ref_facelift_tri(ref_facelift);

  exponent = -1.0 / ((REF_DBL)(2 * p_norm + dimension));

  ref_malloc(metric, 6 * ref_node_max(ref_node), REF_DBL);
  ref_malloc_init(hess, 3 * ref_node_max(ref_grid_node(ref_grid)), REF_DBL,
                  0.0);
  RSS(ref_recon_rsn_hess_face(ref_grid, hess), "rsn");
  each_ref_node_valid_node(ref_node, node) {
    RSS(ref_matrix_det_m2(&(hess[3 * node]), &det), "2x2 det");
    if (det > 0.0) { /* local scaling */
      for (i = 0; i < 3; i++) hess[i + 3 * node] *= pow(det, exponent);
    }
  }

  complexity = 0.0;
  each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
    RSS(ref_node_tri_area(ref_node, nodes, &area), "area");
    for (cell_node = 0; cell_node < ref_cell_node_per(ref_cell); cell_node++) {
      if (ref_node_owned(ref_node, nodes[cell_node])) {
        RSS(ref_matrix_det_m2(&(hess[3 * nodes[cell_node]]), &det), "2x2 det");
        if (det > 0.0) {
          complexity +=
              sqrt(det) * area / ((REF_DBL)ref_cell_node_per(ref_cell));
        }
      }
    }
  }

  if (!ref_math_divisible(target_complexity, complexity)) {
    RSS(REF_DIV_ZERO, "zero compelxity");
  }

  complexity_scale = 1.0;
  each_ref_node_valid_node(ref_node, node) { /* global scaling */
    for (i = 0; i < 3; i++)
      hess[i + 3 * node] *=
          pow(target_complexity / complexity, complexity_scale);
  }

  each_ref_node_valid_node(ref_node, node) {
    RSS(ref_recon_rsn(ref_grid, node, r, s, n), "rsn");
    RSS(ref_matrix_diag_m2(&(hess[3 * node]), diag_system2), "decomp");
    ref_matrix_eig(diag_system, 0) = ref_matrix_eig2(diag_system2, 0);
    for (i = 0; i < 3; i++) {
      ref_matrix_vec(diag_system, i, 0) =
          ref_matrix_vec2(diag_system2, 0, 0) * r[i] +
          ref_matrix_vec2(diag_system2, 1, 0) * s[i];
    }
    ref_matrix_eig(diag_system, 1) = ref_matrix_eig2(diag_system2, 1);
    for (i = 0; i < 3; i++) {
      ref_matrix_vec(diag_system, i, 1) =
          ref_matrix_vec2(diag_system2, 0, 1) * r[i] +
          ref_matrix_vec2(diag_system2, 1, 1) * s[i];
    }
    ref_matrix_eig(diag_system, 2) =
        MAX(ref_matrix_eig2(diag_system2, 0), ref_matrix_eig2(diag_system2, 1));
    for (i = 0; i < 3; i++) ref_matrix_vec(diag_system, i, 2) = n[i];

    RSS(ref_matrix_form_m(diag_system, &(metric[6 * node])), "form m");
    if (verbose) {
      ref_matrix_show_diag_sys(diag_system);
      ref_metric_show(&(metric[6 * node]));
      printf("n %f %f %f\n", n[0], n[1], n[2]);
      printf("v %f %f %f\n", diag_system[0 + 9], diag_system[1 + 9],
             diag_system[2 + 9]);
    }
  }
  ref_free(hess);

  RSS(ref_recon_roundoff_limit(metric, ref_grid), "floor eigs above zero");

  if (steps) {
    RSS(ref_metric_to_node(metric,
                           ref_grid_node(ref_facelift_grid(ref_facelift))),
        "to");
    RSS(ref_export_tec_metric_ellipse(ref_facelift_grid(ref_facelift),
                                      "ref_facelift_raw"),
        "al");
  }

  RSS(ref_facelift_gradation_at_complexity(metric, ref_grid, gradation,
                                           target_complexity),
      "gradation at complexity");

  each_ref_node_valid_node(ref_node, node) {
    RSS(ref_node_metric_get(ref_node, node, m), "curve metric");
    RSS(ref_matrix_intersect(&(metric[6 * node]), m, combined), "intersect");
    if (verbose) {
      ref_metric_show(&(metric[6 * node]));
      ref_metric_show(m);
      ref_metric_show(combined);
      printf("\n");
    }
    for (i = 0; i < 6; i++) metric[i + 6 * node] = combined[i];
  }
  RSS(ref_metric_to_node(metric, ref_grid_node(ref_grid)), "to");

  if (steps) {
    RSS(ref_metric_to_node(metric,
                           ref_grid_node(ref_facelift_grid(ref_facelift))),
        "to");
    RSS(ref_export_tec_metric_ellipse(ref_facelift_grid(ref_facelift),
                                      "ref_facelift_grad"),
        "al");
  }

  ref_free(metric);

  return REF_SUCCESS;
}